

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_loop.cpp
# Opt level: O1

void __thiscall
pseudo_loop::compute_VP(pseudo_loop *this,cand_pos_t i,cand_pos_t j,sparse_tree *tree)

{
  pointer pNVar1;
  pointer piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  energy_t eVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  int *piVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int local_b8;
  int local_68;
  int local_64 [4];
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  lVar25 = (long)i;
  local_44 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar25];
  uVar4 = sparse_tree::Bp(tree,i,j);
  uVar5 = sparse_tree::B(tree,i,j);
  uVar6 = sparse_tree::b(tree,i,j);
  uVar7 = sparse_tree::bp(tree,i,j);
  pNVar1 = (tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar15 = (pNVar1[lVar25].parent)->index;
  local_48 = 10000000;
  uVar23 = ~i;
  local_4c = 10000000;
  if ((((0 < iVar15) && ((int)uVar7 < 0)) && (-1 < (int)(uVar5 | uVar4))) &&
     ((pNVar1[j].parent)->index < iVar15)) {
    local_4c = 0;
    iVar14 = 0;
    if (i < (int)(uVar4 - 1)) {
      iVar14 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)((uVar4 - 1) + uVar23 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar25 + 1])];
    }
    if ((int)uVar5 < j + -1) {
      local_4c = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(int)(j + -1 + ~uVar5 +
                       (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)(int)uVar5 + 1])];
    }
    local_4c = local_4c + iVar14;
  }
  iVar14 = (pNVar1[j].parent)->index;
  if (((iVar15 < iVar14) && ((int)uVar4 < 0)) && ((-1 < (int)(uVar7 | uVar6) && (0 < iVar14)))) {
    local_48 = 0;
    iVar18 = 0;
    if (i < (int)(uVar6 - 1)) {
      iVar18 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)((uVar6 - 1) + uVar23 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar25 + 1])];
    }
    if ((int)uVar7 < j + -1) {
      local_48 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(int)(j + -1 + ~uVar7 +
                       (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)(int)uVar7 + 1])];
    }
    local_48 = local_48 + iVar18;
  }
  local_50 = 10000000;
  iVar18 = 10000000;
  if (((0 < iVar15) && (-1 < (int)(uVar5 | uVar4 | uVar6 | uVar7))) && (0 < iVar14)) {
    iVar14 = 0;
    iVar15 = 0;
    if (i < (int)(uVar4 - 1)) {
      iVar15 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)((uVar4 - 1) + uVar23 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar25 + 1])];
    }
    if ((int)uVar5 < (int)(uVar6 - 1)) {
      iVar14 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)((uVar6 - 1) + ~uVar5 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)(int)uVar5 + 1])];
    }
    iVar18 = 0;
    if ((int)uVar7 < j + -1) {
      iVar18 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)(j + -1 + ~uVar7 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)(int)uVar7 + 1])];
    }
    iVar18 = iVar14 + iVar15 + iVar18;
  }
  lVar25 = lVar25 + 1;
  iVar15 = j + -1;
  lVar20 = (long)iVar15;
  local_b8 = (int)lVar25;
  if (((pNVar1[lVar25].pair < -1) && (pNVar1[lVar20].pair < -1)) &&
     (0 < (short)pair[this->S_[lVar25]][this->S_[lVar20]])) {
    eVar8 = get_e_stP(this,i,j);
    local_50 = 10000000;
    if (local_b8 < iVar15) {
      local_50 = (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(int)(uVar23 + iVar15 +
                       (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar25])];
    }
    local_50 = local_50 + eVar8;
  }
  if (uVar6 < uVar4) {
    uVar4 = uVar6;
  }
  uVar6 = i + 0x1fU;
  if ((int)(j - 4U) < (int)(i + 0x1fU)) {
    uVar6 = j - 4U;
  }
  if ((int)uVar4 <= (int)uVar6) {
    uVar6 = uVar4;
  }
  local_68 = 10000000;
  iVar14 = 10000000;
  local_54 = iVar18;
  if (local_b8 < (int)uVar6) {
    if ((int)uVar5 < (int)uVar7) {
      uVar5 = uVar7;
    }
    local_38 = (ulong)((j - i) - 0x20);
    lVar19 = (long)local_b8;
    iVar18 = (j - i) + -2;
    local_40 = lVar20 << 5 | 6;
    do {
      if (((tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start[lVar19].pair < -1) &&
         (iVar21 = (int)lVar19,
         (int)(uVar23 + iVar21) <=
         (tree->up).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar19 + -1])) {
        iVar9 = (int)local_38 + iVar21;
        if (iVar9 < (int)(uVar5 + 1)) {
          iVar9 = uVar5 + 1;
        }
        if (iVar9 < iVar15) {
          iVar17 = 0;
          uVar22 = local_40;
          lVar26 = lVar20;
          iVar24 = iVar18;
          do {
            iVar10 = iVar14;
            if (((*(int *)((long)&((tree->tree).super__Vector_base<Node,_std::allocator<Node>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->parent + uVar22 * 2) <
                  -1) && (0 < (short)pair[this->S_[lVar19]][this->S_[lVar26]])) &&
               (iVar17 <= (tree->up).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar20])) {
              eVar8 = compute_int(this,i,j,iVar21,(cand_pos_t)lVar26,this->params_);
              lVar11 = lrint((double)eVar8 * e_intP_penalty);
              iVar10 = 10000000;
              if (lVar19 < lVar26) {
                iVar10 = (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar19] + iVar24];
              }
              iVar10 = (int)lVar11 + iVar10;
              if (iVar14 <= iVar10) {
                iVar10 = iVar14;
              }
            }
            iVar14 = iVar10;
            lVar26 = lVar26 + -1;
            iVar24 = iVar24 + -1;
            uVar22 = uVar22 - 0x20;
            iVar17 = iVar17 + 1;
          } while (iVar9 < lVar26);
        }
      }
      lVar19 = lVar19 + 1;
      iVar18 = iVar18 + -1;
    } while (uVar6 != (uint)lVar19);
  }
  uVar4 = sparse_tree::b(tree,i,j);
  uVar5 = sparse_tree::Bp(tree,i,j);
  if (uVar5 < uVar4) {
    uVar4 = uVar5;
  }
  uVar6 = sparse_tree::B(tree,i,j);
  uVar5 = sparse_tree::bp(tree,i,j);
  if ((int)uVar5 < (int)uVar6) {
    uVar5 = uVar6;
  }
  if (local_b8 < (int)uVar4) {
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar18 = (j - i) + -2;
    iVar15 = -1;
    lVar19 = (long)local_b8;
    do {
      local_68 = 10000000;
      iVar21 = 10000000;
      if ((long)local_b8 < lVar19 + -1) {
        iVar21 = (this->WIP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar2[lVar25] + iVar15];
      }
      if (lVar19 < lVar20) {
        local_68 = (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar2[lVar19] + iVar18];
      }
      lVar19 = lVar19 + 1;
      iVar18 = iVar18 + -1;
      iVar9 = (i - uVar4) + iVar15;
      iVar15 = iVar15 + 1;
    } while (iVar9 != -3);
    local_68 = local_68 + iVar21;
  }
  iVar21 = uVar5 + 1;
  iVar18 = 10000000;
  lVar19 = (long)iVar21;
  iVar15 = 10000000;
  if (iVar21 < j) {
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = (j - uVar5) + -3;
    iVar15 = 10000000;
    lVar26 = 0;
    do {
      iVar24 = 10000000;
      if ((long)local_b8 < lVar19 + lVar26) {
        iVar24 = (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)((int)lVar26 + (uVar5 - i) + piVar2[lVar25])]
        ;
      }
      iVar17 = 10000000;
      if (lVar19 + lVar26 + 1 < lVar20) {
        iVar17 = (this->WIP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar2[lVar19 + lVar26 + 1] + iVar9];
      }
      iVar10 = iVar17 + iVar24;
      if (iVar15 <= iVar17 + iVar24) {
        iVar10 = iVar15;
      }
      iVar15 = iVar10;
      iVar9 = iVar9 + -1;
      lVar26 = lVar26 + 1;
    } while (~uVar5 + j != (int)lVar26);
  }
  if (local_b8 < (int)uVar4) {
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar24 = (j - i) + -2;
    iVar18 = 10000000;
    iVar9 = -1;
    lVar26 = (long)local_b8;
    do {
      iVar17 = 10000000;
      if ((long)local_b8 < lVar26 + -1) {
        iVar17 = (this->WIP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar2[lVar25] + iVar9];
      }
      iVar10 = 10000000;
      if (lVar26 < lVar20) {
        iVar10 = (this->VPR).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar2[lVar26] + iVar24];
      }
      iVar3 = iVar10 + iVar17;
      if (iVar18 <= iVar10 + iVar17) {
        iVar3 = iVar18;
      }
      iVar18 = iVar3;
      lVar26 = lVar26 + 1;
      iVar24 = iVar24 + -1;
      iVar17 = iVar9 + (i - uVar4);
      iVar9 = iVar9 + 1;
    } while (iVar17 != -3);
  }
  iVar24 = ap_penalty + bp_penalty * 2;
  iVar9 = 10000000;
  if (iVar21 < j) {
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar21 = (j - uVar5) + -3;
    iVar9 = 10000000;
    lVar26 = 0;
    do {
      iVar17 = 10000000;
      if ((long)local_b8 < lVar19 + lVar26) {
        iVar17 = (this->VPL).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)((uVar5 - i) + (int)lVar26 + piVar2[lVar25])]
        ;
      }
      iVar10 = 10000000;
      if (lVar19 + lVar26 + 1 < lVar20) {
        iVar10 = (this->WIP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar2[lVar19 + lVar26 + 1] + iVar21];
      }
      iVar3 = iVar10 + iVar17;
      if (iVar9 <= iVar10 + iVar17) {
        iVar3 = iVar9;
      }
      iVar9 = iVar3;
      iVar21 = iVar21 + -1;
      lVar26 = lVar26 + 1;
    } while (~uVar5 + j != (int)lVar26);
  }
  piVar12 = local_64;
  local_64[0] = local_4c;
  local_64[1] = local_48;
  local_64[2] = local_54;
  lVar25 = 4;
  do {
    if (*(int *)((long)local_64 + lVar25) < *piVar12) {
      piVar12 = (int *)((long)local_64 + lVar25);
    }
    lVar25 = lVar25 + 4;
  } while (lVar25 != 0xc);
  if (iVar14 < local_50) {
    local_50 = iVar14;
  }
  piVar16 = local_64;
  local_64[0] = local_68 + iVar24;
  local_64[1] = iVar15 + iVar24;
  local_64[2] = iVar18 + iVar24;
  local_64[3] = iVar9 + iVar24;
  lVar25 = 4;
  do {
    if (*(int *)((long)local_64 + lVar25) < *piVar16) {
      piVar16 = (int *)((long)local_64 + lVar25);
    }
    lVar25 = lVar25 + 4;
  } while (lVar25 != 0x10);
  piVar13 = local_64;
  local_64[0] = *piVar12;
  local_64[1] = local_50;
  local_64[2] = *piVar16;
  lVar25 = 4;
  do {
    if (*(int *)((long)local_64 + lVar25) < *piVar13) {
      piVar13 = (int *)((long)local_64 + lVar25);
    }
    lVar25 = lVar25 + 4;
  } while (lVar25 != 0xc);
  (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [(j - i) + local_44] = *piVar13;
  return;
}

Assistant:

void pseudo_loop::compute_VP(cand_pos_t i, cand_pos_t j, sparse_tree &tree){
	cand_pos_t ij = index[i]+j-i;

	const pair_type ptype_closing = pair[S_[i]][S_[j]];	
	
	energy_t m1 = INF, m2 = INF, m3 = INF, m4= INF, m5 = INF, m6 = INF, m7 = INF, m8 = INF, m9 = INF; //different branches
	
	// Borders -- added one to i and j to make it fit current bounds but also subtracted 1 from answer as the tree bounds are shifted as well
	cand_pos_t Bp_ij = tree.Bp(i,j);
	cand_pos_t B_ij = tree.B(i,j);
	cand_pos_t b_ij = tree.b(i,j);
	cand_pos_t bp_ij = tree.bp(i,j);
	
	//branchs:
	// 1) inArc(i) and NOT_inArc(j)
	// WI(i+1)(B'(i,j)-1)+WI(B(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// need to check the borders as they may be negative
	if((tree.tree[i].parent->index) > 0 && (tree.tree[j].parent->index) < (tree.tree[i].parent->index) && Bp_ij >= 0 && B_ij >= 0 && bp_ij < 0){
		energy_t WI_ipus1_BPminus = get_WI(i+1,Bp_ij - 1) ;
		energy_t WI_Bplus_jminus = get_WI(B_ij + 1,j-1);
		m1 =   WI_ipus1_BPminus + WI_Bplus_jminus;
	}

	// 2) NOT_inArc(i) and inArc(j)
	// WI(i+1)(b(i,j)-1)+WI(b'(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// checking the borders as they may be negative
	if ((tree.tree[i].parent->index) < (tree.tree[j].parent->index) && (tree.tree[j].parent->index) > 0 && b_ij>= 0 && bp_ij >= 0 && Bp_ij < 0){
		energy_t WI_i_plus_b_minus = get_WI(i+1,b_ij - 1);
		energy_t WI_bp_plus_j_minus = get_WI(bp_ij + 1,j-1);
		m2 = WI_i_plus_b_minus + WI_bp_plus_j_minus;
	}

	// 3) inArc(i) and inArc(j)
	// WI(i+1)(B'(i,j)-1)+WI(B(i,j)+1)(b(i,j)-1)+WI(b'(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// checking the borders as they may be negative
	if((tree.tree[i].parent->index) > 0 && (tree.tree[j].parent->index) > 0 && Bp_ij >= 0 && B_ij >= 0  && b_ij >= 0 && bp_ij>= 0){
		energy_t WI_i_plus_Bp_minus = get_WI(i+1,Bp_ij - 1);
		energy_t WI_B_plus_b_minus = get_WI(B_ij + 1,b_ij - 1);
		energy_t WI_bp_plus_j_minus = get_WI(bp_ij +1,j - 1);
		m3 = WI_i_plus_Bp_minus + WI_B_plus_b_minus + WI_bp_plus_j_minus;
	}

	// 4) NOT_paired(i+1) and NOT_paired(j-1) and they can pair together
	// e_stP(i,i+1,j-1,j) + VP(i+1)(j-1)
	pair_type ptype_closingip1jm1 = pair[S_[i+1]][S_[j-1]];
	if((tree.tree[i+1].pair) < -1 && (tree.tree[j-1].pair) < -1 && ptype_closingip1jm1>0){
		m4 = get_e_stP(i,j)+ get_VP(i+1,j-1);
	}

	// 5) NOT_paired(r) and NOT_paired(rp)
	//  VP(i,j) = e_intP(i,ip,jp,j) + VP(ip,jp)
	// Hosna, April 6th, 2007
	// whenever we use get_borders we have to check for the correct values
	cand_pos_t min_borders = std::min((cand_pos_tu) Bp_ij, (cand_pos_tu) b_ij);
	cand_pos_t edge_i = std::min(i+MAXLOOP+1,j-TURN-1);
	min_borders = std::min({min_borders,edge_i});
//		printf("B'(%d,%d) = %d, b(%d,%d) = %d, min_borders = %d\n",i,j,get_Bp(i,j),i,j,get_b(i,j), min_borders);
	for (cand_pos_t k = i+1; k < min_borders; ++k){
		// Hosna: April 20, 2007
		// i and ip and j and jp should be in the same arc
		// also it should be the case that [i+1,ip-1] && [jp+1,j-1] are empty regions

		if (tree.tree[k].pair < -1 && (tree.up[(k)-1] >= ((k)-(i)-1))){
			// Hosna, April 6th, 2007
			// whenever we use get_borders we have to check for the correct values
			cand_pos_t max_borders = std::max(bp_ij,B_ij)+1;
			cand_pos_t edge_j = k+j-i-MAXLOOP-2;
			max_borders = std::max({max_borders,edge_j});
			for (cand_pos_t l = j-1; l > max_borders ; --l){

				pair_type ptype_closingkj = pair[S_[k]][S_[l]];
				if (tree.tree[l].pair < -1 && ptype_closingkj>0 && (tree.up[(j)-1] >= ((j)-(l)-1))){
					// Hosna: April 20, 2007
					// i and ip and j and jp should be in the same arc -- If it's unpaired between them, they have to be
					energy_t tmp = get_e_intP(i,k,l,j) + get_VP(k,l);
					m5 = std::min(m5,tmp);
					
				}
			}
		}
	}

		cand_pos_t min_Bp_j = std::min((cand_pos_tu) tree.b(i,j), (cand_pos_tu) tree.Bp(i,j));
		cand_pos_t max_i_bp = std::max(tree.B(i,j),tree.bp(i,j));

		for(cand_pos_t k = i+1; k<min_Bp_j; ++k){
			m6 = get_WIP(i+1,k-1) + get_VP(k,j-1);
		}
		
		m6 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = max_i_bp+1; k<j; ++k){
			m7 = std::min(m7,get_VP(i+1,k) + get_WIP(k+1,j-1));
		}

		m7 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = i+1; k<min_Bp_j; ++k){
			m8 =  std::min(m8,get_WIP(i+1,k-1) + get_VPR(k,j-1));
		}

		m8 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = max_i_bp+1; k<j; ++k){
			m9 = std::min(m9,get_VPL(i+1,k) + get_WIP(k+1,j-1));
		}

		m9 += ap_penalty + 2*bp_penalty;

		



	//finding the min energy
	energy_t vp_h = std::min({m1,m2,m3});
	energy_t vp_iloop = std::min({m4,m5});
	energy_t vp_split = std::min({m6,m7,m8,m9});
	energy_t min = std::min({vp_h,vp_iloop,vp_split});

	VP[ij] = min;
	
}